

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_ref_filtering
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte local_118 [65];
  byte abStack_d7 [199];
  
  uVar4 = nt * 4;
  iVar3 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
    }
  }
  uVar10 = 1 << ((char)iVar3 - 2U & 0x1f);
  if (nt == 0) {
    uVar10 = 0;
  }
  if ((uVar10 & "\x0e"[mode]) == 0) {
    if (pu1_src == pu1_dst) {
      return;
    }
    uVar5 = 0;
    uVar8 = (ulong)(uVar4 | 1);
    if ((int)(uVar4 | 1) < 1) {
      uVar8 = uVar5;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      pu1_dst[uVar5] = pu1_src[uVar5];
    }
    return;
  }
  local_118[0] = *pu1_src;
  uVar10 = (uint)local_118[0];
  if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
    bVar1 = pu1_src[uVar4];
    uVar6 = (uint)bVar1 + (uint)pu1_src[0x40] + (uint)pu1_src[0x60] * -2;
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    uVar11 = pu1_src[0x40] + uVar10 + (uint)pu1_src[0x20] * -2;
    uVar6 = -uVar11;
    if (0 < (int)uVar11) {
      uVar6 = uVar11;
    }
    local_118[uVar4] = bVar1;
    if ((uVar6 < 8) && (uVar9 < 8)) {
      bVar2 = pu1_src[0x40];
      local_118[0x40] = bVar2;
      uVar10 = uVar10 * 0x3f + (uint)bVar2 + 0x20;
      for (uVar8 = 1; uVar8 < 0x40; uVar8 = uVar8 + 1) {
        local_118[uVar8] = (byte)(uVar10 >> 6);
        uVar10 = uVar10 + (int)(short)((ushort)bVar2 - (ushort)local_118[0]);
      }
      uVar10 = (uint)bVar2 * 0x3f + (uint)bVar1 + 0x20;
      for (lVar7 = 0x41; lVar7 - 0x40U < 0x40; lVar7 = lVar7 + 1) {
        local_118[lVar7] = (byte)(uVar10 >> 6);
        uVar10 = uVar10 + (int)(short)((ushort)bVar1 - (ushort)bVar2);
      }
      goto LAB_001581b1;
    }
  }
  else {
    local_118[(int)uVar4] = pu1_src[(int)uVar4];
  }
  uVar9 = 1;
  if (1 < (int)uVar4) {
    uVar9 = uVar4;
  }
  for (uVar8 = 0; uVar9 - 1 != uVar8; uVar8 = uVar8 + 1) {
    bVar1 = pu1_src[uVar8 + 1];
    local_118[uVar8 + 1] = (byte)(uVar10 + (uint)bVar1 * 2 + (uint)pu1_src[uVar8 + 2] + 2 >> 2);
    uVar10 = (uint)bVar1;
  }
LAB_001581b1:
  uVar5 = 0;
  uVar8 = (ulong)(uVar4 | 1);
  if ((int)(uVar4 | 1) < 1) {
    uVar8 = uVar5;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    pu1_dst[uVar5] = local_118[uVar5];
  }
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering(UWORD8 *pu1_src,
                                    WORD32 nt,
                                    UWORD8 *pu1_dst,
                                    WORD32 mode,
                                    WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    /*WORD32 dc_val = 1 << (BIT_DEPTH - 5);*/
    WORD32 dc_val = 1 << (8 - 5);
    //WORD32 strong_intra_smoothing_enable_flag  = 1;

    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            for(i = 0; i < (four_nt + 1); i++)
                pu1_dst[i] = pu1_src[i];
        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (ABS(pu1_src[2 * nt] + pu1_src[4 * nt]
                            - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (ABS(pu1_src[2 * nt] + pu1_src[0]
                            - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;

        }
        else
        {
            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt - 1); i++)
            {
                au1_flt[i + 1] = (pu1_src[i] + 2 * pu1_src[i + 1]
                                + pu1_src[i + 2] + 2) >> 2;
            }
        }


        for(i = 0; i < (four_nt + 1); i++)
            pu1_dst[i] = au1_flt[i];
    }

}